

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPub.c
# Opt level: O3

void sbfPubRemoveEventCb(int fd,short events,void *closure)

{
  int *piVar1;
  long lVar2;
  long *__ptr;
  undefined8 *__ptr_00;
  undefined8 uVar3;
  long *plVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  long *plVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  
  lVar2 = *(long *)((long)closure + 0x18);
  if (*(int *)((long)closure + 0x14) == 0) {
    *(undefined4 *)((long)closure + 0xc) = 1;
    uVar3 = *(undefined8 *)(lVar2 + 8);
    pcVar8 = sbfTopic_getTopic(*closure);
    sbfLog_log(uVar3,0,"not removing publisher %p (%s); not ready",closure,pcVar8);
    return;
  }
  __ptr = *(long **)((long)closure + 0x20);
  __ptr_00 = *(undefined8 **)((long)closure + 0x28);
  uVar3 = *(undefined8 *)(lVar2 + 8);
  pcVar8 = sbfTopic_getTopic(*closure);
  sbfLog_log(uVar3,0,"removing publisher %p (%s) (stream %p)",closure,pcVar8,__ptr);
  lVar9 = *(long *)((long)closure + 0x158);
  plVar4 = *(long **)((long)closure + 0x160);
  puVar10 = (undefined8 *)(lVar9 + 0x160);
  if (lVar9 == 0) {
    puVar10 = __ptr_00 + 2;
  }
  *puVar10 = plVar4;
  *plVar4 = lVar9;
  if (__ptr_00[1] != 0) goto LAB_00104049;
  sbfLog_log(*(undefined8 *)(*__ptr + 8),0,"removing topic %p",__ptr_00);
  LOCK();
  plVar4 = __ptr + 3;
  *(int *)plVar4 = (int)*plVar4 + -1;
  lVar7 = *plVar4;
  UNLOCK();
  plVar4 = __ptr + 4;
  lVar9 = __ptr_00[0xb];
  if (__ptr_00[10] == 0) {
    lVar11 = __ptr_00[0xc];
    iVar14 = *(int *)(__ptr_00 + 0xd);
    if (lVar9 != 0) goto LAB_00103c63;
    lVar9 = 0;
LAB_00103c6f:
    plVar13 = plVar4;
    if (lVar11 != 0) {
      plVar13 = (long *)(lVar11 + 0x58);
      if (*(undefined8 **)(lVar11 + 0x50) == __ptr_00) {
        plVar13 = (long *)(lVar11 + 0x50);
      }
    }
    *plVar13 = lVar9;
  }
  else {
    if (lVar9 == 0) {
      lVar11 = __ptr_00[0xc];
      iVar14 = *(int *)(__ptr_00 + 0xd);
      lVar9 = __ptr_00[10];
LAB_00103c63:
      *(long *)(lVar9 + 0x60) = lVar11;
      goto LAB_00103c6f;
    }
    do {
      lVar15 = lVar9;
      lVar9 = *(long *)(lVar15 + 0x50);
    } while (*(long *)(lVar15 + 0x50) != 0);
    lVar9 = *(long *)(lVar15 + 0x58);
    lVar11 = *(long *)(lVar15 + 0x60);
    iVar14 = *(int *)(lVar15 + 0x68);
    if (lVar9 != 0) {
      *(long *)(lVar9 + 0x60) = lVar11;
    }
    plVar13 = plVar4;
    if (lVar11 != 0) {
      plVar13 = (long *)(lVar11 + 0x58);
      if (*(long *)(lVar11 + 0x50) == lVar15) {
        plVar13 = (long *)(lVar11 + 0x50);
      }
    }
    *plVar13 = lVar9;
    if (*(undefined8 **)(lVar15 + 0x60) == __ptr_00) {
      lVar11 = lVar15;
    }
    uVar3 = __ptr_00[10];
    uVar5 = __ptr_00[0xb];
    uVar6 = __ptr_00[0xd];
    *(undefined8 *)(lVar15 + 0x60) = __ptr_00[0xc];
    *(undefined8 *)(lVar15 + 0x68) = uVar6;
    *(undefined8 *)(lVar15 + 0x50) = uVar3;
    *(undefined8 *)(lVar15 + 0x58) = uVar5;
    lVar17 = __ptr_00[0xc];
    plVar13 = plVar4;
    if (lVar17 != 0) {
      plVar13 = (long *)(lVar17 + 0x58);
      if (*(undefined8 **)(lVar17 + 0x50) == __ptr_00) {
        plVar13 = (long *)(lVar17 + 0x50);
      }
    }
    *plVar13 = lVar15;
    *(long *)(__ptr_00[10] + 0x60) = lVar15;
    if (__ptr_00[0xb] != 0) {
      *(long *)(__ptr_00[0xb] + 0x60) = lVar15;
    }
    lVar15 = lVar11;
    if (lVar11 == 0) {
      lVar11 = 0;
    }
    else {
      do {
        plVar13 = (long *)(lVar15 + 0x60);
        lVar15 = *plVar13;
      } while (*plVar13 != 0);
    }
  }
  if (iVar14 == 0) {
    do {
      if ((lVar9 != 0) && (*(int *)(lVar9 + 0x68) != 0)) goto LAB_00103f98;
      lVar15 = *plVar4;
      if (lVar9 == lVar15) goto LAB_00103f93;
      lVar17 = *(long *)(lVar11 + 0x50);
      if (lVar17 == lVar9) {
        lVar9 = *(long *)(lVar11 + 0x58);
        lVar12 = lVar9;
        if (*(int *)(lVar9 + 0x68) == 1) {
          *(undefined4 *)(lVar9 + 0x68) = 0;
          *(undefined4 *)(lVar11 + 0x68) = 1;
          lVar12 = *(long *)(lVar9 + 0x50);
          *(long *)(lVar11 + 0x58) = lVar12;
          if (lVar12 != 0) {
            *(long *)(lVar12 + 0x60) = lVar11;
          }
          lVar17 = *(long *)(lVar11 + 0x60);
          *(long *)(lVar9 + 0x60) = lVar17;
          if (lVar17 == 0) {
            *plVar4 = lVar9;
            lVar15 = lVar9;
          }
          else if (lVar11 == *(long *)(lVar17 + 0x50)) {
            *(long *)(lVar17 + 0x50) = lVar9;
          }
          else {
            *(long *)(lVar17 + 0x58) = lVar9;
            lVar12 = *(long *)(lVar11 + 0x58);
          }
          *(long *)(lVar9 + 0x50) = lVar11;
          *(long *)(lVar11 + 0x60) = lVar9;
        }
        lVar9 = *(long *)(lVar12 + 0x50);
        if ((lVar9 != 0) && (*(int *)(lVar9 + 0x68) != 0)) {
          lVar17 = *(long *)(lVar12 + 0x58);
          if ((lVar17 == 0) || (*(int *)(lVar17 + 0x68) == 0)) {
            *(undefined4 *)(lVar9 + 0x68) = 0;
            *(undefined4 *)(lVar12 + 0x68) = 1;
            lVar17 = *(long *)(lVar9 + 0x58);
            *(long *)(lVar12 + 0x50) = lVar17;
            if (lVar17 != 0) {
              *(long *)(lVar17 + 0x60) = lVar12;
            }
            lVar17 = *(long *)(lVar12 + 0x60);
            *(long *)(lVar9 + 0x60) = lVar17;
            lVar16 = lVar9;
            plVar13 = plVar4;
            if (lVar17 != 0) {
              lVar16 = lVar15;
              plVar13 = (long *)(lVar17 + 0x58);
              if (lVar12 == *(long *)(lVar17 + 0x50)) {
                plVar13 = (long *)(lVar17 + 0x50);
              }
            }
            *plVar13 = lVar9;
            *(long *)(lVar9 + 0x58) = lVar12;
            *(long *)(lVar12 + 0x60) = lVar9;
            lVar12 = *(long *)(lVar11 + 0x58);
            lVar17 = *(long *)(lVar12 + 0x58);
            *(undefined4 *)(lVar12 + 0x68) = *(undefined4 *)(lVar11 + 0x68);
            *(undefined4 *)(lVar11 + 0x68) = 0;
            if (lVar17 != 0) goto LAB_00103f49;
          }
          else {
LAB_00103e11:
            *(undefined4 *)(lVar12 + 0x68) = *(undefined4 *)(lVar11 + 0x68);
            *(undefined4 *)(lVar11 + 0x68) = 0;
            lVar16 = lVar15;
LAB_00103f49:
            *(undefined4 *)(lVar17 + 0x68) = 0;
          }
          lVar9 = *(long *)(lVar12 + 0x50);
          *(long *)(lVar11 + 0x58) = lVar9;
          if (lVar9 != 0) {
            *(long *)(lVar9 + 0x60) = lVar11;
          }
          lVar15 = *(long *)(lVar11 + 0x60);
          *(long *)(lVar12 + 0x60) = lVar15;
          plVar13 = plVar4;
          lVar9 = lVar12;
          if (lVar15 != 0) {
            plVar13 = (long *)(lVar15 + 0x58);
            lVar9 = lVar16;
            if (lVar11 == *(long *)(lVar15 + 0x50)) {
              plVar13 = (long *)(lVar15 + 0x50);
            }
          }
          *plVar13 = lVar12;
          *(long *)(lVar12 + 0x50) = lVar11;
          goto LAB_00103f8f;
        }
        lVar17 = *(long *)(lVar12 + 0x58);
        if ((lVar17 != 0) && (*(int *)(lVar17 + 0x68) != 0)) goto LAB_00103e11;
      }
      else {
        lVar12 = lVar17;
        if (*(int *)(lVar17 + 0x68) == 1) {
          *(undefined4 *)(lVar17 + 0x68) = 0;
          *(undefined4 *)(lVar11 + 0x68) = 1;
          lVar12 = *(long *)(lVar17 + 0x58);
          *(long *)(lVar11 + 0x50) = lVar12;
          if (lVar12 != 0) {
            *(long *)(lVar12 + 0x60) = lVar11;
          }
          lVar9 = *(long *)(lVar11 + 0x60);
          *(long *)(lVar17 + 0x60) = lVar9;
          if (lVar9 == 0) {
            *plVar4 = lVar17;
            lVar15 = lVar17;
          }
          else if (lVar11 == *(long *)(lVar9 + 0x50)) {
            *(long *)(lVar9 + 0x50) = lVar17;
            lVar12 = *(long *)(lVar11 + 0x50);
          }
          else {
            *(long *)(lVar9 + 0x58) = lVar17;
          }
          *(long *)(lVar17 + 0x58) = lVar11;
          *(long *)(lVar11 + 0x60) = lVar17;
        }
        lVar9 = *(long *)(lVar12 + 0x50);
        if ((lVar9 != 0) && (*(int *)(lVar9 + 0x68) != 0)) goto LAB_00103de2;
        lVar17 = *(long *)(lVar12 + 0x58);
        if ((lVar17 != 0) && (*(int *)(lVar17 + 0x68) != 0)) goto LAB_00103dd6;
      }
      *(undefined4 *)(lVar12 + 0x68) = 1;
      lVar9 = lVar11;
      lVar11 = *(long *)(lVar11 + 0x60);
    } while( true );
  }
LAB_00103fa0:
  if ((int)lVar7 == 0) {
    if (*plVar4 != 0) {
      __assert_fail("!empty || ((&tstream->mTopics)->rbh_root == ((void*)0))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/blu-corner[P]sbf/src/transport/sbfTportPrivate.h"
                    ,0xc5,"int sbfTport_removeTopic(sbfTportStream, sbfTportTopic)");
    }
    free((void *)*__ptr_00);
    free(__ptr_00);
    pthread_mutex_lock((pthread_mutex_t *)(lVar2 + 0x180));
    if ((int)__ptr[3] == 0) {
      sbfLog_log(*(undefined8 *)(lVar2 + 8),0,"removing stream %p",__ptr);
      lVar9 = __ptr[10];
      plVar4 = (long *)__ptr[0xb];
      plVar13 = (long *)(lVar9 + 0x58);
      if (lVar9 == 0) {
        plVar13 = (long *)(lVar2 + 0x178);
      }
      *plVar13 = (long)plVar4;
      *plVar4 = lVar9;
      (**(code **)(*(long *)(lVar2 + 0x20) + 0x28))(__ptr[2]);
      pthread_mutex_destroy((pthread_mutex_t *)(__ptr + 5));
      free(__ptr);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(lVar2 + 0x180));
  }
  else {
    free((void *)*__ptr_00);
    free(__ptr_00);
  }
LAB_00104049:
  LOCK();
  piVar1 = (int *)((long)closure + 0x10);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 != 0) {
    return;
  }
  free(*(void **)((long)closure + 0x148));
  sbfTopic_destroy(*closure);
  free(closure);
  return;
LAB_00103dd6:
  if ((lVar9 == 0) || (*(int *)(lVar9 + 0x68) == 0)) {
    *(undefined4 *)(lVar17 + 0x68) = 0;
    *(undefined4 *)(lVar12 + 0x68) = 1;
    lVar9 = *(long *)(lVar17 + 0x50);
    *(long *)(lVar12 + 0x58) = lVar9;
    if (lVar9 != 0) {
      *(long *)(lVar9 + 0x60) = lVar12;
    }
    lVar9 = *(long *)(lVar12 + 0x60);
    *(long *)(lVar17 + 0x60) = lVar9;
    lVar16 = lVar17;
    plVar13 = plVar4;
    if (lVar9 != 0) {
      lVar16 = lVar15;
      plVar13 = (long *)(lVar9 + 0x58);
      if (lVar12 == *(long *)(lVar9 + 0x50)) {
        plVar13 = (long *)(lVar9 + 0x50);
      }
    }
    *plVar13 = lVar17;
    *(long *)(lVar17 + 0x50) = lVar12;
    *(long *)(lVar12 + 0x60) = lVar17;
    lVar12 = *(long *)(lVar11 + 0x50);
    lVar9 = *(long *)(lVar12 + 0x50);
    *(undefined4 *)(lVar12 + 0x68) = *(undefined4 *)(lVar11 + 0x68);
    *(undefined4 *)(lVar11 + 0x68) = 0;
    if (lVar9 != 0) goto LAB_00103e93;
  }
  else {
LAB_00103de2:
    *(undefined4 *)(lVar12 + 0x68) = *(undefined4 *)(lVar11 + 0x68);
    *(undefined4 *)(lVar11 + 0x68) = 0;
    lVar16 = lVar15;
LAB_00103e93:
    *(undefined4 *)(lVar9 + 0x68) = 0;
  }
  lVar9 = *(long *)(lVar12 + 0x58);
  *(long *)(lVar11 + 0x50) = lVar9;
  if (lVar9 != 0) {
    *(long *)(lVar9 + 0x60) = lVar11;
  }
  lVar15 = *(long *)(lVar11 + 0x60);
  *(long *)(lVar12 + 0x60) = lVar15;
  plVar13 = plVar4;
  lVar9 = lVar12;
  if (lVar15 != 0) {
    plVar13 = (long *)(lVar15 + 0x58);
    lVar9 = lVar16;
    if (lVar11 == *(long *)(lVar15 + 0x50)) {
      plVar13 = (long *)(lVar15 + 0x50);
    }
  }
  *plVar13 = lVar12;
  *(long *)(lVar12 + 0x58) = lVar11;
LAB_00103f8f:
  *(long *)(lVar11 + 0x60) = lVar12;
LAB_00103f93:
  if (lVar9 != 0) {
LAB_00103f98:
    *(undefined4 *)(lVar9 + 0x68) = 0;
  }
  goto LAB_00103fa0;
}

Assistant:

static void
sbfPubRemoveEventCb (int fd, short events, void* closure)
{
    sbfPub         pub0 = closure;
    sbfTport       tport = pub0->mTport;
    sbfTportStream tstream = pub0->mTportStream;
    sbfTportTopic  ttopic = pub0->mTportTopic;

    /*
     * If the pub is waiting for the stream to be added, the remove event could
     * be fired before it is ready. If so, defer the remove until the add
     * stream complete callback. The flag is set so the later callback knows
     * this callback has already fired and isn't queued behind it.
     */
    if (!pub0->mReady)
    {
        pub0->mRemoved = 1;
        sbfLog_debug (tport->mLog,
                      "not removing publisher %p (%s); not ready",
                      pub0,
                      sbfTopic_getTopic (pub0->mTopic));
        return;
    }

    sbfLog_debug (tport->mLog,
                  "removing publisher %p (%s) (stream %p)",
                  pub0,
                  sbfTopic_getTopic (pub0->mTopic),
                  tstream);

    TAILQ_REMOVE (&ttopic->mPubs, pub0, mEntry);
    if (TAILQ_EMPTY (&ttopic->mPubs) && sbfTport_removeTopic (tstream, ttopic))
    {
        sbfMutex_lock (&tport->mStreamsLock);
        /*
         * Reference count could be bumped between removeTopic (outside the
         * lock) and here.
         */
        if (sbfRefCount_get (&tstream->mRefCount) == 0)
            sbfTport_removeStream (tport, tstream);
        sbfMutex_unlock (&tport->mStreamsLock);
    }

    if (sbfRefCount_decrement (&pub0->mRefCount))
        sbfPubFree (pub0);
}